

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

void __thiscall CTcConstVal::demote_float(CTcConstVal *this)

{
  int32_t iVar1;
  CTcConstVal *in_RDI;
  int32_t i;
  int ov;
  vbignum_t b;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  vbignum_t *this_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_14;
  vbignum_t local_10 [2];
  
  if ((in_RDI->typ_ == 0xd) && (((byte)in_RDI->field_0x20 >> 1 & 1) != 0)) {
    this_00 = local_10;
    vbignum_t::vbignum_t
              ((vbignum_t *)in_RDI,
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),(size_t)this_00
               ,in_stack_ffffffffffffffbc);
    iVar1 = vbignum_t::to_int(this_00,(int *)CONCAT44(in_stack_ffffffffffffffbc,
                                                      in_stack_ffffffffffffffb8));
    if (local_14 == 0) {
      set_int(in_RDI,(long)iVar1);
    }
    vbignum_t::~vbignum_t(this_00);
  }
  return;
}

Assistant:

void CTcConstVal::demote_float()
{
    /* if this is a promoted integer, see if we can demote it back to int */
    if (typ_ == TC_CVT_FLOAT && promoted_)
    {
        /* get the BigNumber value */
        vbignum_t b(val_.floatval_.txt_, val_.floatval_.len_, 0);

        /* convert it to an integer */
        int ov;
        int32_t i = b.to_int(ov);

        /* if it didn't overflow, demote the constant back to an int */
        if (!ov)
            set_int(i);
    }
}